

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getDataFromFile(File *this)

{
  long *this_00;
  long *plVar1;
  long lVar2;
  runtime_error *prVar3;
  undefined8 *in_RSI;
  int *in_R9;
  undefined1 auVar4 [16];
  char local_5c [4];
  string local_58;
  undefined8 local_38;
  
  plVar1 = (long *)operator_new(0x210);
  std::ios_base::ios_base((ios_base *)(plVar1 + 0x21));
  plVar1[0x3c] = 0;
  *(undefined2 *)(plVar1 + 0x3d) = 0;
  plVar1[0x3e] = 0;
  plVar1[0x3f] = 0;
  plVar1[0x40] = 0;
  plVar1[0x41] = 0;
  this_00 = plVar1 + 2;
  *plVar1 = 0x1e3258;
  plVar1[0x21] = 0x1e3280;
  plVar1[1] = 0;
  std::ios::init((streambuf *)(plVar1 + 0x21));
  *plVar1 = (long)&PTR__offsetifstream_001e3208;
  plVar1[0x21] = (long)&PTR__offsetifstream_001e3230;
  std::filebuf::filebuf(this_00);
  plVar1[2] = (long)&PTR__filebuf_001e32b8;
  plVar1[0x20] = 0;
  std::filebuf::open((char *)this_00,(_Ios_Openmode)*in_RSI);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_5c[0] = -0x66;
    local_5c[1] = '\0';
    local_5c[2] = '\0';
    local_5c[3] = '\0';
    util::str<char[28],char[87],char[2],int>
              (&local_58,(util *)"Assertion `*ifs` failed at ",
               (char (*) [28])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lrit/file.cc"
               ,(char (*) [87])0x1b1e61,(char (*) [2])local_5c,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)&local_58);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg(plVar1,*(undefined4 *)(in_RSI + 0x11),0);
  if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    if (*(char *)((long)in_RSI + 0x84) == '\0') {
      auVar4 = std::istream::tellg();
      local_38 = auVar4._8_8_;
      std::istream::seekg((long)plVar1,_S_beg);
      lVar2 = std::istream::tellg();
      std::istream::seekg(plVar1,auVar4._0_8_,local_38);
      lVar2 = lVar2 - (auVar4._0_8_ + (in_RSI[0x12] * 0x20000000 + 0xe0000000 >> 0x20));
      if (0 < lVar2) {
        std::istream::seekg((long)plVar1,(_Ios_Seekdir)lVar2);
        if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_5c[0] = -0x51;
          local_5c[1] = '\0';
          local_5c[2] = '\0';
          local_5c[3] = '\0';
          util::str<char[28],char[87],char[2],int>
                    (&local_58,(util *)"Assertion `*ifs` failed at ",
                     (char (*) [28])
                     "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lrit/file.cc"
                     ,(char (*) [87])0x1b1e61,(char (*) [2])local_5c,in_R9);
          std::runtime_error::runtime_error(prVar3,(string *)&local_58);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    lVar2 = (**(code **)(*this_00 + 0x20))(this_00,0,1,8);
    plVar1[0x20] = lVar2;
    (this->file_)._M_dataplus._M_p = (pointer)plVar1;
    return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
              )this;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_5c[0] = -100;
  local_5c[1] = '\0';
  local_5c[2] = '\0';
  local_5c[3] = '\0';
  util::str<char[28],char[87],char[2],int>
            (&local_58,(util *)"Assertion `*ifs` failed at ",
             (char (*) [28])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lrit/file.cc"
             ,(char (*) [87])0x1b1e61,(char (*) [2])local_5c,in_R9);
  std::runtime_error::runtime_error(prVar3,(string *)&local_58);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<std::istream> File::getDataFromFile() const {
  auto ifs = std::make_unique<offsetifstream>(file_);
  ASSERT(*ifs);
  ifs->seekg(ph_.totalHeaderLength);
  ASSERT(*ifs);

  // Because of a bug in goesdec, LRIT image files that used
  // compression have an initial bogus line, followed by the real
  // image. Detect if this is one of those files and ignore the bogus
  // line if so. See 2bd11f16 for more info.
  if (ph_.fileType == 0) {
    // Number of bytes remaining in file
    std::streampos fpos1 = ifs->tellg();
    ifs->seekg(0, std::ios::end);
    std::streampos fpos2 = ifs->tellg();
    ifs->seekg(fpos1);
    // Seek to first byte beyond bogus line
    // Round up (hence the + 7) so that images with 1 bit per pixel
    // and a number of pixels not equal to a power of 8 are not
    // accidentally made 1 byte shorter than expected.
    auto delta = (fpos2 - fpos1) - ((int) ((ph_.dataLength + 7) / 8));
    if (delta > 0) {
      ifs->seekg(delta, ifs->cur);
      ASSERT(*ifs);
    }
  }

  // Current position is the start of the data section,
  // and the 0-offset for other code that uses it.
  ifs->mark();

  return std::unique_ptr<std::istream>(ifs.release());
}